

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

Status __thiscall google::protobuf::File::RecursivelyCreateDir(File *this,string *path,int mode)

{
  bool bVar1;
  string_view message;
  string_view message_00;
  string local_88;
  byte local_61;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  long local_50;
  size_type slashpos;
  Status local_28;
  int local_1c;
  string *psStack_18;
  int mode_local;
  string *path_local;
  Status *_status;
  
  local_1c = mode;
  psStack_18 = path;
  path_local = (string *)this;
  CreateDir((File *)&local_28,path,mode);
  bVar1 = absl::lts_20250127::Status::ok(&local_28);
  absl::lts_20250127::Status::~Status(&local_28);
  if (bVar1) {
    absl::lts_20250127::OkStatus();
  }
  else {
    bVar1 = Exists(psStack_18);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&slashpos,"Path already exists"
                );
      message._M_str = (char *)slashpos;
      message._M_len = (size_t)this;
      absl::lts_20250127::AlreadyExistsError(message);
    }
    else {
      local_50 = std::__cxx11::string::find_last_of((char)psStack_18,0x2f);
      if (local_50 == -1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_60,"No parent given");
        message_00._M_str = (char *)local_60._M_len;
        message_00._M_len = (size_t)this;
        absl::lts_20250127::FailedPreconditionError(message_00);
      }
      else {
        local_61 = 0;
        std::__cxx11::string::substr((ulong)&local_88,(ulong)psStack_18);
        RecursivelyCreateDir(this,&local_88,local_1c);
        std::__cxx11::string::~string((string *)&local_88);
        bVar1 = absl::lts_20250127::Status::ok((Status *)this);
        bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
        if (bVar1) {
          local_61 = 1;
        }
        if ((local_61 & 1) == 0) {
          absl::lts_20250127::Status::~Status((Status *)this);
        }
        if (!bVar1) {
          CreateDir(this,psStack_18,local_1c);
        }
      }
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status File::RecursivelyCreateDir(const std::string& path, int mode) {
  if (CreateDir(path, mode).ok()) return absl::OkStatus();

  if (Exists(path)) return absl::AlreadyExistsError("Path already exists");

  // Try creating the parent.
  std::string::size_type slashpos = path.find_last_of('/');
  if (slashpos == std::string::npos) {
    return absl::FailedPreconditionError("No parent given");
  }

  RETURN_IF_ERROR(RecursivelyCreateDir(path.substr(0, slashpos), mode));
  return CreateDir(path, mode);
}